

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubByteTypes.cpp
# Opt level: O2

vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_> *
MILBlob::UnPackSubByteVecImpl<MILBlob::Int4>
          (vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vec,size_t numElements)

{
  long lVar1;
  pointer puVar2;
  type tVar3;
  invalid_argument *this;
  size_t i;
  pointer puVar4;
  size_t index;
  double dVar5;
  undefined1 auVar6 [16];
  Span<MILBlob::Int4,_18446744073709551615UL> subByteSpan;
  
  std::vector<MILBlob::Int4,_std::allocator<MILBlob::Int4>_>::vector
            (__return_storage_ptr__,numElements,(allocator_type *)&subByteSpan);
  puVar4 = (vec->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vec->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar1 = numElements * 4;
  auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar6._0_8_ = lVar1;
  auVar6._12_4_ = 0x45300000;
  dVar5 = ceil(((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 0.125);
  if ((long)puVar2 - (long)puVar4 ==
      ((long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5)) {
    if (numElements == 0) {
      puVar4 = (pointer)0x0;
    }
    subByteSpan.m_ptr = puVar4;
    subByteSpan.m_size.m_size = numElements;
    for (index = 0; numElements != index; index = index + 1) {
      tVar3 = Util::Span<MILBlob::Int4,_18446744073709551615UL>::ValueAt(&subByteSpan,index);
      (__return_storage_ptr__->super__Vector_base<MILBlob::Int4,_std::allocator<MILBlob::Int4>_>).
      _M_impl.super__Vector_impl_data._M_start[index].data = tVar3.data;
    }
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this,
             "Unpacking to sub-byte type vector has invalid number of elements. Sub-byte vector with NumElements requires exactly vec.size() bytes."
            );
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::vector<T> UnPackSubByteVecImpl(const std::vector<uint8_t>& vec, size_t numElements)
{
    std::vector<T> ret(numElements);
    MILVerifyIsTrue(
        vec.size() == MILBlob::SizeInBytes<T>(numElements),
        std::invalid_argument,
        "Unpacking to sub-byte type vector has invalid number of elements. Sub-byte vector with NumElements "
        "requires exactly vec.size() bytes.");
    Util::Span<T> subByteSpan((typename MILBlob::Util::voidType<T>::type)(vec.data()), numElements);
    for (size_t i = 0; i < numElements; i++) {
        ret[i] = subByteSpan.ValueAt(i);
    }
    return ret;
}